

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O1

Map_Time_t * Abc_NtkMapCopyCiArrivalCon(Abc_Ntk_t *pNtk)

{
  Map_Time_t *pMVar1;
  Scl_Con_t *pSVar2;
  long lVar3;
  size_t __nmemb;
  float *pfVar4;
  float fVar5;
  
  __nmemb = (size_t)pNtk->vCis->nSize;
  pMVar1 = (Map_Time_t *)calloc(__nmemb,0xc);
  if (0 < (long)__nmemb) {
    pfVar4 = &pMVar1->Worst;
    lVar3 = 0;
    do {
      pSVar2 = Scl_ConReadMan();
      if ((pSVar2->vInArrs).nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      fVar5 = (float)(pSVar2->vInArrs).pArray[lVar3] / 1000.0;
      *pfVar4 = fVar5;
      ((Map_Time_t *)(pfVar4 + -2))->Rise = fVar5;
      pfVar4[-1] = fVar5;
      lVar3 = lVar3 + 1;
      pfVar4 = pfVar4 + 3;
    } while (lVar3 < pNtk->vCis->nSize);
  }
  return pMVar1;
}

Assistant:

Map_Time_t * Abc_NtkMapCopyCiArrivalCon( Abc_Ntk_t * pNtk )
{
    Map_Time_t * p; int i;
    p = ABC_CALLOC( Map_Time_t, Abc_NtkCiNum(pNtk) );
    for ( i = 0; i < Abc_NtkCiNum(pNtk); i++ )
        p[i].Fall = p[i].Rise = p[i].Worst = Scl_Int2Flt( Scl_ConGetInArr(i) );
    return p;
}